

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O1

QList<QString> * __thiscall
QSet<QString>::values(QList<QString> *__return_storage_ptr__,QSet<QString> *this)

{
  ulong uVar1;
  size_t asize;
  Data *pDVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pDVar2 = (this->q_hash).d;
  if (pDVar2 == (Data *)0x0) {
    asize = 0;
  }
  else {
    asize = pDVar2->size;
  }
  QList<QString>::reserve(__return_storage_ptr__,asize);
  pDVar2 = (this->q_hash).d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else if (pDVar2->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pDVar2->numBuckets == uVar3) goto LAB_00135363;
      uVar1 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    goto LAB_00135366;
  }
  uVar3 = 0;
LAB_00135366:
  do {
    if (uVar3 == 0 && pDVar2 == (Data *)0x0) {
      return __return_storage_ptr__;
    }
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (QString *)
               (((pDVar2->spans[uVar3 >> 7].entries)->storage).data +
               (uint)pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] * 0x18));
    QList<QString>::end(__return_storage_ptr__);
    do {
      if (pDVar2->numBuckets - 1 == uVar3) goto LAB_00135363;
      uVar3 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  } while( true );
LAB_00135363:
  uVar3 = 0;
  pDVar2 = (Data *)0x0;
  goto LAB_00135366;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}